

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

uint32_t __thiscall io_buf::hash(io_buf *this)

{
  undefined8 uVar1;
  long in_RDI;
  stringstream __msg;
  string *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  vw_exception *in_stack_fffffffffffffe60;
  stringstream local_190 [16];
  ostream local_180;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_190);
    std::operator<<(&local_180,"HASH WAS NOT CALCULATED");
    uVar1 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
               in_stack_fffffffffffffe48);
    __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return *(uint32_t *)(in_RDI + 0xc);
}

Assistant:

uint32_t hash()
  {
    if (!_verify_hash)
      THROW("HASH WAS NOT CALCULATED");
    return _hash;
  }